

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O2

void __thiscall Heap::sort_up(Heap *this,GridNode *item)

{
  GridNode *item_00;
  int iVar1;
  int iVar2;
  
  while( true ) {
    iVar1 = (item->index + -1) / 2;
    iVar2 = iVar1;
    if (iVar1 < 1) {
      iVar2 = 0;
    }
    if (this->maxCount <= iVar1) {
      iVar2 = this->maxCount + -1;
    }
    item_00 = this->list[iVar2];
    iVar2 = GridNode::compare_item(item,item_00);
    if (iVar2 < 1) break;
    swap_items(this,item,item_00);
  }
  return;
}

Assistant:

void sort_up(GridNode *item)
    {
        int parentIndex = clamp((item->index - 1) / 2, 0, maxCount - 1);
        while (true)
        {
            GridNode *parent = list[parentIndex];
            if (item->compare_item(parent) > 0)
            {
                swap_items(item, parent);
            }
            else
            {
                break;
            }
            parentIndex = clamp((item->index - 1) / 2, 0, maxCount - 1);
        }
    }